

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo>,_false> __thiscall
duckdb::make_unsafe_uniq_array<duckdb::ParseTypeInfo>(duckdb *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__s;
  ulong uVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(5),0);
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(5),8) == 0) {
    uVar3 = uVar2;
  }
  __s = operator_new__(uVar3);
  if (n != 0) {
    uVar2 = uVar2 - 5;
    switchD_014c3389::default(__s,0,(uVar2 - uVar2 % 5) + 5);
  }
  *(void **)this = __s;
  return (unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>)
         (unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>)this;
}

Assistant:

inline unique_ptr<DATA_TYPE[], std::default_delete<DATA_TYPE>, false>
make_unsafe_uniq_array(size_t n) // NOLINT: mimic std style
{
	return unique_ptr<DATA_TYPE[], std::default_delete<DATA_TYPE>, false>(new DATA_TYPE[n]());
}